

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifySRBCompatibility
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,CommittedShaderResources *Resources
          ,function<Diligent::PipelineResourceSignatureVkImpl_*(unsigned_int)> *CustomGetSignature)

{
  byte bVar1;
  ShaderResourceCacheVk *pSVar2;
  PipelineResourceSignatureVkImpl *pPRS;
  bool bVar3;
  Uint32 UVar4;
  PipelineResourceSignatureVkImpl *this_00;
  ShaderResourceCacheImplType *in_RCX;
  uint Index;
  PipelineStateVkImpl *pPVar5;
  PipelineResourceSignatureDesc *in_R8;
  undefined4 in_stack_ffffffffffffff88;
  RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> pSRB;
  string msg;
  
  pPVar5 = (this->m_pPipelineState).m_pObject;
  if (pPVar5 == (PipelineStateVkImpl *)0x0) {
    FormatString<char[31]>(&msg,(char (*) [31])"No PSO is bound in the context");
    in_RCX = (ShaderResourceCacheImplType *)0xa82;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpVerifySRBCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa82);
    std::__cxx11::string::~string((string *)&msg);
    pPVar5 = (this->m_pPipelineState).m_pObject;
  }
  UVar4 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignatureCount
                    (&pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  Index = 0;
  do {
    if (UVar4 <= Index) {
      return;
    }
    if ((CustomGetSignature->super__Function_base)._M_manager == (_Manager_type)0x0) {
      this_00 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                          (&((this->m_pPipelineState).m_pObject)->
                            super_PipelineStateBase<Diligent::EngineVkImplTraits>,Index);
    }
    else {
      this_00 = std::function<Diligent::PipelineResourceSignatureVkImpl_*(unsigned_int)>::operator()
                          (CustomGetSignature,Index);
    }
    if ((this_00 != (PipelineResourceSignatureVkImpl *)0x0) &&
       ((this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
        .m_Desc.NumResources != 0)) {
      if (7 < Index) {
        FormatString<char[26],char[31]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"sign < MAX_RESOURCE_SIGNATURES",(char (*) [31])in_RCX);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpVerifySRBCompatibility",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0xa8b);
        std::__cxx11::string::~string((string *)&msg);
      }
      bVar1 = (this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              .m_Desc.BindingIndex;
      if (Index != bVar1) {
        FormatString<char[26],char[41]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pPSOSign->GetDesc().BindingIndex == sign",
                   (char (*) [41])(ulong)bVar1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpVerifySRBCompatibility",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0xa8c);
        std::__cxx11::string::~string((string *)&msg);
      }
      RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Lock
                ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)&pSRB);
      pSVar2 = (Resources->ResourceCaches)._M_elems[Index];
      if (pSVar2 == (ShaderResourceCacheVk *)0x0) {
        if (pSRB.m_pObject != (ShaderResourceBindingVkImpl *)0x0) {
          FormatString<char[100]>
                    (&msg,(char (*) [100])
                          "Shader resource cache pointer is null, but SRB is not null. This is unexpected and is likely a bug."
                    );
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"DvpVerifySRBCompatibility",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0xa99);
          goto LAB_0027f65f;
        }
LAB_0027f671:
        pPVar5 = (this->m_pPipelineState).m_pObject;
        PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
                  (&pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
        in_R8 = (PipelineResourceSignatureDesc *)&stack0xffffffffffffff8c;
        FormatString<char[17],char_const*,char[25],unsigned_int,char[81]>
                  (&msg,(Diligent *)"Pipeline state \'",
                   (char (*) [17])
                   &(pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                    .m_Desc,(char **)"\' requires SRB at index ",(char (*) [25])in_R8,
                   (uint *)
                   ", but none is bound in the device context. Did you call CommitShaderResources()?"
                   ,(char (*) [81])CONCAT44(Index,in_stack_ffffffffffffff88));
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpVerifySRBCompatibility",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0xa9d);
        std::__cxx11::string::~string((string *)&msg);
      }
      else if (pSRB.m_pObject == (ShaderResourceBindingVkImpl *)0x0) {
        FormatString<char[40],unsigned_int,char[236]>
                  (&msg,(Diligent *)"Shader resource cache pointer at index ",
                   (char (*) [40])&stack0xffffffffffffff8c,
                   (uint *)
                   " is non-null, but the corresponding SRB is null. This indicates that the SRB has been released while still being used by the context commands. This usage is invalid. A resource must be released only after the last command that uses it."
                   ,(char (*) [236])in_R8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpVerifySRBCompatibility",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0xa95);
LAB_0027f65f:
        std::__cxx11::string::~string((string *)&msg);
        if (pSRB.m_pObject == (ShaderResourceBindingVkImpl *)0x0) goto LAB_0027f671;
      }
      in_RCX = &((pSRB.m_pObject)->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
                m_ShaderResourceCache;
      if (pSVar2 != in_RCX) {
        FormatString<char[26],char[36]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pCache == &pSRB->GetResourceCache()",(char (*) [36])in_RCX);
        in_RCX = (ShaderResourceCacheImplType *)0xa9f;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpVerifySRBCompatibility",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0xa9f);
        std::__cxx11::string::~string((string *)&msg);
      }
      pPRS = ((pSRB.m_pObject)->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
             m_pPRS.m_pObject;
      bVar3 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::IsCompatibleWith
                        (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                         ,(IPipelineResourceSignature *)pPRS);
      if (!bVar3) {
        pPVar5 = (this->m_pPipelineState).m_pObject;
        PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
                  (&pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
        in_R8 = &(pPRS->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                 .m_Desc;
        FormatString<char[34],unsigned_int,char[18],char_const*,char[48],char_const*,char[3]>
                  (&msg,(Diligent *)"Shader resource binding at index ",
                   (char (*) [34])&stack0xffffffffffffff8c,(uint *)" with signature \'",
                   (char (*) [18])in_R8,(char **)"\' is not compatible with the signature in PSO \'"
                   ,(char (*) [48])
                    &(pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                     .m_Desc,(char **)"\'.",(char (*) [3])CONCAT44(Index,in_stack_ffffffffffffff88))
        ;
        in_RCX = (ShaderResourceCacheImplType *)0xaa4;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpVerifySRBCompatibility",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0xaa4);
        std::__cxx11::string::~string((string *)&msg);
      }
      RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::Release(&pSRB);
    }
    Index = Index + 1;
  } while( true );
}

Assistant:

void DeviceContextBase<ImplementationTraits>::DvpVerifySRBCompatibility(
    CommittedShaderResources&                                 Resources,
    std::function<PipelineResourceSignatureImplType*(Uint32)> CustomGetSignature) const
{
    DEV_CHECK_ERR(m_pPipelineState, "No PSO is bound in the context");

    const Uint32 SignCount = m_pPipelineState->GetResourceSignatureCount();
    for (Uint32 sign = 0; sign < SignCount; ++sign)
    {
        const PipelineResourceSignatureImplType* const pPSOSign = CustomGetSignature ? CustomGetSignature(sign) : m_pPipelineState->GetResourceSignature(sign);
        if (pPSOSign == nullptr || pPSOSign->GetTotalResourceCount() == 0)
            continue; // Skip null and empty signatures

        VERIFY_EXPR(sign < MAX_RESOURCE_SIGNATURES);
        VERIFY_EXPR(pPSOSign->GetDesc().BindingIndex == sign);

        RefCntAutoPtr<ShaderResourceBindingImplType> pSRB   = Resources.SRBs[sign].Lock();
        const ShaderResourceCacheImplType*           pCache = Resources.ResourceCaches[sign];
        if (pCache != nullptr)
        {
            DEV_CHECK_ERR(pSRB, "Shader resource cache pointer at index ", sign,
                          " is non-null, but the corresponding SRB is null. This indicates that the SRB has been released while still "
                          "being used by the context commands. This usage is invalid. A resource must be released only after "
                          "the last command that uses it.");
        }
        else
        {
            VERIFY(!pSRB, "Shader resource cache pointer is null, but SRB is not null. This is unexpected and is likely a bug.");
        }

        DEV_CHECK_ERR(pSRB, "Pipeline state '", m_pPipelineState->GetDesc().Name, "' requires SRB at index ", sign,
                      ", but none is bound in the device context. Did you call CommitShaderResources()?");

        VERIFY_EXPR(pCache == &pSRB->GetResourceCache());

        const PipelineResourceSignatureImplType* const pSRBSign = pSRB->GetSignature();
        DEV_CHECK_ERR(pPSOSign->IsCompatibleWith(pSRBSign), "Shader resource binding at index ", sign, " with signature '",
                      pSRBSign->GetDesc().Name, "' is not compatible with the signature in PSO '",
                      m_pPipelineState->GetDesc().Name, "'.");
    }
}